

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffhdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
             int *status)

{
  int iVar1;
  void *pvVar2;
  char *__dest;
  int in_ECX;
  int in_ESI;
  long *in_R8;
  int *in_R9;
  char *headptr;
  char keyname [75];
  char keybuf [162];
  long jj;
  long ii;
  int totkeys;
  int exact;
  int match;
  int casesn;
  int *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  char in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffea9;
  char local_108 [104];
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  long local_58;
  long local_50;
  int local_48;
  int local_40;
  int local_4;
  
  *in_R9 = 0;
  if (*(int *)headptr < 1) {
    iVar1 = ffghsp((fitsfile *)CONCAT71(in_stack_fffffffffffffea9,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(int *)0x1ce3bf);
    if (iVar1 < 1) {
      pvVar2 = calloc((long)((local_48 + 1) * 0x50 + 1),1);
      *in_R8 = (long)pvVar2;
      if (*in_R8 == 0) {
        headptr[0] = 'q';
        headptr[1] = '\0';
        headptr[2] = '\0';
        headptr[3] = '\0';
        ffpmsg((char *)0x1ce42d);
        local_4 = *(int *)headptr;
      }
      else {
        __dest = (char *)*in_R8;
        for (local_50 = 1; local_50 <= local_48; local_50 = local_50 + 1) {
          ffgrec((fitsfile *)CONCAT71(in_stack_fffffffffffffea9,in_stack_fffffffffffffea8),
                 (int)((ulong)__dest >> 0x20),(char *)in_stack_fffffffffffffe98,(int *)0x1ce4a7);
          strcat(local_108,
                 "                                                                                ")
          ;
          in_stack_fffffffffffffea8 = '\0';
          strncat(&stack0xfffffffffffffea8,local_108,8);
          if ((in_ESI == 0) ||
             ((((('C' < in_stack_fffffffffffffea8 || (in_stack_fffffffffffffea8 < 'C')) ||
                (iVar1 = strcmp("COMMENT ",&stack0xfffffffffffffea8), iVar1 != 0)) &&
               ((('H' < in_stack_fffffffffffffea8 || (in_stack_fffffffffffffea8 < 'H')) ||
                (iVar1 = strcmp("HISTORY ",&stack0xfffffffffffffea8), iVar1 != 0)))) &&
              (((' ' < in_stack_fffffffffffffea8 || (in_stack_fffffffffffffea8 < ' ')) ||
               (iVar1 = strcmp("        ",&stack0xfffffffffffffea8), iVar1 != 0)))))) {
            local_58 = 0;
            while ((local_58 < in_ECX &&
                   (ffcmps(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60), local_40 == 0))) {
              local_58 = local_58 + 1;
            }
            if (local_58 == in_ECX) {
              strcpy(__dest,local_108);
              __dest = __dest + 0x50;
              *in_R9 = *in_R9 + 1;
            }
          }
        }
        strcpy(__dest,
               "END                                                                             ");
        *in_R9 = *in_R9 + 1;
        __dest[0x50] = '\0';
        pvVar2 = realloc((void *)*in_R8,(long)(*in_R9 * 0x50 + 1));
        *in_R8 = (long)pvVar2;
        local_4 = *(int *)headptr;
      }
    }
    else {
      local_4 = *(int *)headptr;
    }
  }
  else {
    local_4 = *(int *)headptr;
  }
  return local_4;
}

Assistant:

int ffhdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.  If exclude_comm is TRUE, then all 
  the COMMENT, HISTORY, and <blank> keywords will be excluded from the output
  string of keywords.  Any other list of keywords to be excluded may be
  specified with the exclist parameter.
*/
{
    int casesn, match, exact, totkeys;
    long ii, jj;
    char keybuf[162], keyname[FLEN_KEYWORD], *headptr;

    *nkeys = 0;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &totkeys, NULL, status) > 0)
        return(*status);

    /* allocate memory for all the keywords */
    /* (will reallocate it later to minimize the memory size) */
    
    *header = (char *) calloc ( (totkeys + 1) * 80 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    headptr = *header;
    casesn = FALSE;

    /* read every keyword */
    for (ii = 1; ii <= totkeys; ii++) 
    {
        ffgrec(fptr, ii, keybuf, status);
        /* pad record with blanks so that it is at least 80 chars long */
        strcat(keybuf,
    "                                                                                ");

        keyname[0] = '\0';
        strncat(keyname, keybuf, 8); /* copy the keyword name */
        
        if (exclude_comm)
        {
            if (!FSTRCMP("COMMENT ", keyname) ||
                !FSTRCMP("HISTORY ", keyname) ||
                !FSTRCMP("        ", keyname) )
              continue;  /* skip this commentary keyword */
        }

        /* does keyword match any names in the exclusion list? */
        for (jj = 0; jj < nexc; jj++ )
        {
            ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                 if (match)
                     break;
        }

        if (jj == nexc)
        {
            /* not in exclusion list, add this keyword to the string */
            strcpy(headptr, keybuf);
            headptr += 80;
            (*nkeys)++;
        }
    }

    /* add the END keyword */
    strcpy(headptr,
    "END                                                                             ");
    headptr += 80;
    (*nkeys)++;

    *headptr = '\0';   /* terminate the header string */
    /* minimize the allocated memory */
    *header = (char *) realloc(*header, (*nkeys *80) + 1);  

    return(*status);
}